

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sunrealtype *in_RCX;
  undefined8 *in_RDX;
  N_Vector in_RSI;
  int in_EDI;
  sunrealtype sVar4;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  long local_38;
  int local_2c;
  
  if (in_EDI == 1) {
    sVar4 = N_VDotProd_Serial(in_RSI,(N_Vector)*in_RDX);
    *in_RCX = sVar4;
  }
  else {
    lVar1 = *in_RSI->content;
    lVar2 = *(long *)((long)in_RSI->content + 0x10);
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      lVar3 = *(long *)(*(long *)in_RDX[local_2c] + 0x10);
      in_RCX[local_2c] = 0.0;
      for (local_38 = 0; local_38 < lVar1; local_38 = local_38 + 1) {
        in_RCX[local_2c] =
             *(double *)(lVar2 + local_38 * 8) * *(double *)(lVar3 + local_38 * 8) +
             in_RCX[local_2c];
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y,
                                  sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VDotProd */
  if (nvec == 1)
  {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i = 0; i < nvec; i++)
  {
    yd          = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j = 0; j < N; j++) { dotprods[i] += xd[j] * yd[j]; }
  }

  return SUN_SUCCESS;
}